

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_keyword_is_write(NGP_TOKEN *ngp_tok)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  long in_RDI;
  int spc;
  int l;
  int j;
  int i;
  int local_18;
  int local_14;
  
  if (in_RDI == 0) {
    return 0x16a;
  }
  for (local_18 = 0; ngp_keyword_is_write::nmni[local_18] != (char *)0x0; local_18 = local_18 + 1) {
    iVar2 = strcmp(ngp_keyword_is_write::nmni[local_18],(char *)(in_RDI + 4));
    if (iVar2 == 0) {
      return 0x170;
    }
  }
  local_18 = 0;
  while( true ) {
    if (ngp_keyword_is_write::nm[local_18] == (char *)0x0) {
      return 0;
    }
    sVar3 = strlen(ngp_keyword_is_write::nm[local_18]);
    local_14 = (int)sVar3;
    if (((0 < local_14) && (local_14 < 6)) &&
       (iVar2 = strncmp(ngp_keyword_is_write::nm[local_18],(char *)(in_RDI + 4),(long)local_14),
       iVar2 == 0)) break;
    local_18 = local_18 + 1;
  }
  if (('0' < *(char *)(in_RDI + 4 + (long)local_14)) &&
     (*(char *)(in_RDI + 4 + (long)local_14) < ':')) {
    bVar1 = false;
    do {
      while( true ) {
        local_14 = local_14 + 1;
        if (7 < local_14) {
          return 0x170;
        }
        if (bVar1) break;
        if ((*(char *)(in_RDI + 4 + (long)local_14) < '0') ||
           ('9' < *(char *)(in_RDI + 4 + (long)local_14))) {
          if (*(char *)(in_RDI + 4 + (long)local_14) != ' ') {
            if (*(char *)(in_RDI + 4 + (long)local_14) == '\0') {
              return 0x170;
            }
            return 0;
          }
          bVar1 = true;
        }
      }
    } while (*(char *)(in_RDI + 4 + (long)local_14) == ' ');
    return 0;
  }
  return 0;
}

Assistant:

int	ngp_keyword_is_write(NGP_TOKEN *ngp_tok)
 { int i, j, l, spc;
                        /* indexed variables not to write */

   static char *nm[] = { "NAXIS", "TFORM", "TTYPE", NULL } ;

                        /* non indexed variables not allowed to write */
  
   static char *nmni[] = { "SIMPLE", "XTENSION", "BITPIX", "NAXIS", "PCOUNT",
                           "GCOUNT", "TFIELDS", "THEAP", "EXTEND", "EXTVER",
                           NULL } ;

   if (NULL == ngp_tok) return(NGP_NUL_PTR);

   for (j = 0; ; j++)           /* first check non indexed */
    { if (NULL == nmni[j]) break;
      if (0 == strcmp(nmni[j], ngp_tok->name)) return(NGP_BAD_ARG);
    } 

   for (j = 0; ; j++)           /* now check indexed */
    { if (NULL == nm[j]) return(NGP_OK);
      l = strlen(nm[j]);
      if ((l < 1) || (l > 5)) continue;
      if (0 == strncmp(nm[j], ngp_tok->name, l)) break;
    } 

   if ((ngp_tok->name[l] < '1') || (ngp_tok->name[l] > '9')) return(NGP_OK);
   spc = 0;
   for (i = l + 1; i < 8; i++)
    { if (spc) { if (' ' != ngp_tok->name[i]) return(NGP_OK); }
      else
       { if ((ngp_tok->name[i] >= '0') && (ngp_tok->name[i] <= '9')) continue;
         if (' ' == ngp_tok->name[i]) { spc = 1; continue; }
         if (0 == ngp_tok->name[i]) break;
         return(NGP_OK);
       }
    }
   return(NGP_BAD_ARG);
 }